

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cc
# Opt level: O0

t_object * __thiscall xemmai::t_symbol::f_instantiate(t_symbol *this,wstring_view a_value)

{
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __x;
  iterator this_00;
  bool bVar1;
  pointer ppVar2;
  t_global *a_library;
  t_object *ptVar3;
  byte local_a1;
  void *local_90;
  const_iterator local_88;
  _Base_ptr local_80;
  __sv_type local_78;
  t_engine *local_68;
  wchar_t *local_60;
  _Self local_58;
  _Self local_50;
  iterator i;
  map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>_>
  *instances;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  t_engine *engine;
  wstring_view a_value_local;
  
  a_value_local._M_len = a_value._M_len;
  engine = (t_engine *)this;
  lock._M_device = (mutex_type *)f_engine();
  std::lock_guard<std::mutex>::lock_guard
            (&local_30,&((t_engine *)lock._M_device)->v_symbol__instantiate__mutex);
  std::mutex::lock((mutex *)((long)&lock._M_device[9].super___mutex_base._M_mutex + 8));
  i._M_node = (_Base_ptr)(lock._M_device[0x1b].super___mutex_base._M_mutex.__size + 8);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::wstring,xemmai::t_slot,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>>
       ::lower_bound<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                 ((map<std::__cxx11::wstring,xemmai::t_slot,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>>
                   *)i._M_node,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&engine);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>_>
       ::end(i._M_node);
  bVar1 = std::operator==(&local_50,&local_58);
  local_a1 = 1;
  if (!bVar1) {
    local_68 = engine;
    local_60 = (wchar_t *)a_value_local._M_len;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>
             ::operator->(&local_50);
    local_78 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)ppVar2);
    __x._M_str = local_60;
    __x._M_len = (size_t)local_68;
    bVar1 = std::operator==(__x,local_78);
    local_a1 = bVar1 ^ 0xff;
  }
  this_00._M_node = i._M_node;
  if ((local_a1 & 1) == 0) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>
             ::operator->(&local_50);
    ptVar3 = t_slot::operator->(&ppVar2->second);
    ptVar3->v_reviving = true;
    std::mutex::unlock((mutex *)((long)&lock._M_device[9].super___mutex_base._M_mutex + 8));
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>
             ::operator->(&local_50);
    a_value_local._M_str = (wchar_t *)t_slot::operator_cast_to_t_object_(&ppVar2->second);
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>
    ::_Rb_tree_const_iterator(&local_88,&local_50);
    local_90 = (void *)0x0;
    local_80 = (_Base_ptr)
               std::
               map<std::__cxx11::wstring,xemmai::t_slot,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>>
               ::
               emplace_hint<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>&,decltype(nullptr)>
                         (this_00._M_node,local_88,
                          (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&engine,
                          &local_90);
    local_50._M_node = local_80;
    std::mutex::unlock((mutex *)((long)&lock._M_device[9].super___mutex_base._M_mutex + 8));
    a_library = f_global();
    a_value_local._M_str =
         (wchar_t *)
         f_new<xemmai::t_symbol,xemmai::t_global,std::_Rb_tree_iterator<std::pair<std::__cxx11::wstring_const,xemmai::t_slot>>&>
                   (a_library,&local_50);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return (t_object *)a_value_local._M_str;
}

Assistant:

t_object* t_symbol::f_instantiate(std::wstring_view a_value)
{
	auto engine = f_engine();
	std::lock_guard lock(engine->v_symbol__instantiate__mutex);
	engine->v_object__reviving__mutex.lock();
	auto& instances = engine->v_symbol__instances;
	auto i = instances.lower_bound(a_value);
	if (i == instances.end() || i->first != a_value) {
		i = instances.emplace_hint(i, a_value, nullptr);
		engine->v_object__reviving__mutex.unlock();
		return f_new<t_symbol>(f_global(), i);
	} else {
		i->second->v_reviving = true;
		engine->v_object__reviving__mutex.unlock();
		return i->second;
	}
}